

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

bool __thiscall
HighsMipSolverData::rootSeparationRound
          (HighsMipSolverData *this,HighsSeparation *sepa,HighsInt *ncuts,Status *status)

{
  bool bVar1;
  HighsInt HVar2;
  Status SVar3;
  int64_t iVar4;
  vector<double,_std::allocator<double>_> *this_00;
  Highs *this_01;
  Status *in_RCX;
  HighsPrimalHeuristics *in_RDX;
  long *in_RDI;
  double dVar5;
  vector<double,_std::allocator<double>_> *solvals;
  int64_t tmpLpIters;
  HighsMipSolverData *in_stack_00000088;
  Status *in_stack_000001a8;
  HighsDomain *in_stack_000001b0;
  HighsSeparation *in_stack_000001b8;
  vector<double,_std::allocator<double>_> *in_stack_000059e8;
  HighsPrimalHeuristics *in_stack_000059f0;
  long lVar6;
  bool local_1;
  
  iVar4 = HighsLpRelaxation::getNumLpIterations((HighsLpRelaxation *)(in_RDI + 0xd9));
  lVar6 = -iVar4;
  HVar2 = HighsSeparation::separationRound(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8);
  *(HighsInt *)&in_RDX->mipsolver = HVar2;
  iVar4 = HighsLpRelaxation::getNumLpIterations((HighsLpRelaxation *)(in_RDI + 0xd9));
  this_00 = (vector<double,_std::allocator<double>_> *)(iVar4 + lVar6);
  dVar5 = HighsLpRelaxation::getAvgSolveIters((HighsLpRelaxation *)(in_RDI + 0xd9));
  in_RDI[0xce2] = (long)dVar5;
  in_RDI[0xced] =
       (long)&(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start + in_RDI[0xced];
  in_RDI[0xcef] =
       (long)&(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start + in_RDI[0xcef];
  SVar3 = evaluateRootLp(in_stack_00000088);
  *in_RCX = SVar3;
  if (*in_RCX == kInfeasible) {
    local_1 = true;
  }
  else {
    this_01 = HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)(in_RDI + 0xd9));
    Highs::getSolution(this_01);
    if (((*(byte *)(*in_RDI + 0xb0) & 1) != 0) ||
       (bVar1 = std::vector<double,_std::allocator<double>_>::empty(this_00), bVar1)) {
      HighsPrimalHeuristics::randomizedRounding(in_stack_000059f0,in_stack_000059e8);
      HighsPrimalHeuristics::flushStatistics(in_RDX);
      SVar3 = evaluateRootLp(in_stack_00000088);
      *in_RCX = SVar3;
      if (*in_RCX == kInfeasible) {
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsMipSolverData::rootSeparationRound(
    HighsSeparation& sepa, HighsInt& ncuts, HighsLpRelaxation::Status& status) {
  int64_t tmpLpIters = -lp.getNumLpIterations();
  ncuts = sepa.separationRound(domain, status);
  tmpLpIters += lp.getNumLpIterations();
  avgrootlpiters = lp.getAvgSolveIters();
  total_lp_iterations += tmpLpIters;
  sepa_lp_iterations += tmpLpIters;

  status = evaluateRootLp();
  if (status == HighsLpRelaxation::Status::kInfeasible) return true;

  const std::vector<double>& solvals = lp.getLpSolver().getSolution().col_value;

  if (mipsolver.submip || incumbent.empty()) {
    heuristics.randomizedRounding(solvals);
    heuristics.flushStatistics();
    status = evaluateRootLp();
    if (status == HighsLpRelaxation::Status::kInfeasible) return true;
  }

  return false;
}